

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O0

JSONObject * __thiscall
Js::JSONStringifier::ReadObject
          (JSONStringifier *this,RecyclableObject *obj,JSONObjectStack *objectStack)

{
  JavascriptString *propertyName_00;
  code *pcVar1;
  PropertyListElement *this_00;
  bool bVar2;
  EnumeratorFlags EVar3;
  uint32 uVar4;
  int iVar5;
  uint propertyCount_00;
  Recycler *pRVar6;
  SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *this_01;
  undefined4 *puVar7;
  SListNodeBase<Memory::Recycler> **ppSVar8;
  Type *this_02;
  JavascriptString **ppJVar9;
  PropertyRecord **ppPVar10;
  JavascriptLibrary *this_03;
  Type *type;
  JavascriptProxy *local_178;
  PropertyRecord *pPStack_130;
  uint propertyCount;
  PropertyRecord *propertyRecord;
  uint32 numericIndex;
  PropertyId nextKey;
  JavascriptString *propertyName;
  EnumeratorCache *cache;
  JavascriptStaticEnumerator enumerator;
  JavascriptProxy *proxyObject;
  PropertyListElement *entry;
  Iterator __iter;
  TrackAllocData local_98;
  SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *local_70;
  JSONObject *jsonObject;
  Recycler *recycler;
  undefined1 auStack_58 [4];
  charcount_t stepbackLength;
  JSONObjectStack stack;
  JSONObjectStack *objectStack_local;
  RecyclableObject *obj_local;
  JSONStringifier *this_local;
  SListNodeBase<Memory::Recycler> local_28;
  PropertyListElement **local_20;
  bool local_11;
  RecyclableObject *local_10;
  
  stack.next = objectStack;
  bVar2 = JSONObjectStack::Has(objectStack,obj);
  if (bVar2) {
    JavascriptError::ThrowTypeError(this->scriptContext,-0x7ff5ec56,(PCWSTR)0x0);
  }
  memset(auStack_58,0,0x10);
  stack.object = (RecyclableObject *)stack.next;
  recycler._4_4_ = this->indentLength;
  _auStack_58 = obj;
  if (this->gapLength != 0) {
    uVar4 = UInt32Math::Add(this->indentLength,this->gapLength);
    this->indentLength = uVar4;
  }
  pRVar6 = ScriptContext::GetRecycler(this->scriptContext);
  jsonObject = (JSONObject *)pRVar6;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_98,(type_info *)&SListCounted<Js::JSONObjectProperty,Memory::Recycler>::typeinfo
             ,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONStringifier.cpp"
             ,0x23a);
  pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_98);
  __iter.current = (NodeBase *)Memory::Recycler::AllocInlined;
  this_01 = (SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *)
            new<Memory::Recycler>(0x18,pRVar6,0x43c4b0);
  SListCounted<Js::JSONObjectProperty,_Memory::Recycler>::SListCounted
            ((SListCounted<Js::JSONObjectProperty,_Memory::Recycler> *)this_01,
             (Recycler *)jsonObject);
  local_70 = this_01;
  if (this->propertyList == (PropertyList *)0x0) {
    local_10 = obj;
    bVar2 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(obj);
    if (bVar2) {
      local_178 = UnsafeVarTo<Js::JavascriptProxy,Js::RecyclableObject>(local_10);
    }
    else {
      local_178 = (JavascriptProxy *)0x0;
    }
    enumerator.arrayEnumerator.ptr = (JavascriptEnumerator *)local_178;
    if (local_178 == (JavascriptProxy *)0x0) {
      JavascriptStaticEnumerator::JavascriptStaticEnumerator((JavascriptStaticEnumerator *)&cache);
      this_03 = ScriptContext::GetLibrary(this->scriptContext);
      type = RecyclableObject::GetType(obj);
      propertyName = (JavascriptString *)JavascriptLibrary::GetStringifyCache(this_03,type);
      EVar3 = operator|(SnapShotSemantics,EphemeralReference);
      EVar3 = operator|(EVar3,UseCache);
      iVar5 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x2b])
                        (obj,&cache,(ulong)EVar3,this->scriptContext,propertyName);
      if (iVar5 != 0) {
        _numericIndex = (JavascriptString *)0x0;
        propertyRecord._4_4_ = -1;
        while (_numericIndex =
                    JavascriptStaticEnumerator::MoveAndGetNext
                              ((JavascriptStaticEnumerator *)&cache,
                               (PropertyId *)((long)&propertyRecord + 4),(PropertyAttributes *)0x0),
              _numericIndex != (JavascriptString *)0x0) {
          propertyRecord._0_4_ =
               JavascriptStaticEnumerator::GetCurrentItemIndex((JavascriptStaticEnumerator *)&cache)
          ;
          if ((uint32)propertyRecord == 0xffffffff) {
            pPStack_130 = (PropertyRecord *)0x0;
            if (propertyRecord._4_4_ == -1) {
              ScriptContext::GetOrAddPropertyRecord
                        (this->scriptContext,_numericIndex,&stack0xfffffffffffffed0);
              propertyRecord._4_4_ = PropertyRecord::GetPropertyId(pPStack_130);
            }
            ReadObjectElement(this,_numericIndex,pPStack_130,obj,(JSONObject *)local_70,
                              (JSONObjectStack *)auStack_58);
          }
          else {
            ReadObjectElement(this,_numericIndex,(uint32)propertyRecord,obj,(JSONObject *)local_70,
                              (JSONObjectStack *)auStack_58);
          }
        }
        _numericIndex = (JavascriptString *)0x0;
      }
    }
    else {
      ReadProxy(this,local_178,(JSONObject *)local_70,(JSONObjectStack *)auStack_58);
    }
  }
  else {
    _entry = SListBase<Js::JSONStringifier::PropertyListElement,_Memory::Recycler,_RealCount>::
             GetIterator(&this->propertyList->
                          super_SListBase<Js::JSONStringifier::PropertyListElement,_Memory::Recycler,_RealCount>
                        );
    while( true ) {
      local_20 = &entry;
      if (__iter.list ==
          (SListBase<Js::JSONStringifier::PropertyListElement,_Memory::Recycler,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      this_00 = entry;
      SListNodeBase<Memory::Recycler>::Next(&local_28);
      ppSVar8 = Memory::WriteBarrierPtr::operator_cast_to_SListNodeBase__
                          ((WriteBarrierPtr *)&local_28);
      bVar2 = SListBase<Js::JSONStringifier::PropertyListElement,_Memory::Recycler,_RealCount>::
              IsHead((SListBase<Js::JSONStringifier::PropertyListElement,_Memory::Recycler,_RealCount>
                      *)this_00,*ppSVar8);
      if (!bVar2) {
        SListNodeBase<Memory::Recycler>::Next((SListNodeBase<Memory::Recycler> *)&this_local);
        Memory::WriteBarrierPtr::operator_cast_to_SListNodeBase__((WriteBarrierPtr *)&this_local);
      }
      local_11 = !bVar2;
      if (!local_11) break;
      this_02 = SListBase<Js::JSONStringifier::PropertyListElement,_Memory::Recycler,_RealCount>::
                Iterator::Data((Iterator *)&entry);
      ppJVar9 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptString__
                          ((WriteBarrierPtr *)&this_02->propertyName);
      propertyName_00 = *ppJVar9;
      ppPVar10 = Memory::WriteBarrierPtr::operator_cast_to_PropertyRecord__
                           ((WriteBarrierPtr *)this_02);
      ReadObjectElement(this,propertyName_00,*ppPVar10,obj,(JSONObject *)local_70,
                        (JSONObjectStack *)auStack_58);
    }
  }
  SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount>::Reverse(local_70);
  propertyCount_00 = RealCount::Count(&local_70->super_RealCount);
  CalculateStringifiedLength(this,propertyCount_00,recycler._4_4_);
  this->indentLength = recycler._4_4_;
  return (JSONObject *)local_70;
}

Assistant:

JSONObject*
JSONStringifier::ReadObject(_In_ RecyclableObject* obj, _In_ JSONObjectStack* objectStack)
{
    if (objectStack->Has(obj))
    {
        JavascriptError::ThrowTypeError(this->scriptContext, JSERR_JSONSerializeCircular);
    }
    JSONObjectStack stack = { 0 };
    stack.next = objectStack;
    stack.object = obj;

    // Increase indentation
    const charcount_t stepbackLength = this->indentLength;
    if (this->gapLength != 0)
    {
        this->indentLength = UInt32Math::Add(this->indentLength, this->gapLength);
    }

    Recycler* recycler = this->scriptContext->GetRecycler();
    JSONObject* jsonObject = RecyclerNew(recycler, JSONObject, recycler);

    // If we are given a property list, we should only read the listed properties
    if (this->propertyList != nullptr)
    {
        FOREACH_SLIST_ENTRY(PropertyListElement, entry, this->propertyList)
        {
            this->ReadObjectElement(entry.propertyName, entry.propertyRecord, obj, jsonObject, &stack);
        }
        NEXT_SLIST_ENTRY;
    }
    else
    {
        // Enumerating proxies is different than normal objects, so enumerate them separately
        JavascriptProxy* proxyObject = JavascriptOperators::TryFromVar<JavascriptProxy>(obj);
        if (proxyObject != nullptr)
        {
            this->ReadProxy(proxyObject, jsonObject, &stack);
        }
        else
        {
            JavascriptStaticEnumerator enumerator;
            EnumeratorCache* cache = this->scriptContext->GetLibrary()->GetStringifyCache(obj->GetType());
            if (obj->GetEnumerator(&enumerator, EnumeratorFlags::SnapShotSemantics | EnumeratorFlags::EphemeralReference | EnumeratorFlags::UseCache, this->scriptContext, cache))
            {
                JavascriptString* propertyName = nullptr;
                PropertyId nextKey = Constants::NoProperty;
                while ((propertyName = enumerator.MoveAndGetNext(nextKey)) != nullptr)
                {
                    const uint32 numericIndex = enumerator.GetCurrentItemIndex();
                    if (numericIndex != Constants::InvalidSourceIndex)
                    {
                        this->ReadObjectElement(propertyName, numericIndex, obj, jsonObject, &stack);
                    }
                    else
                    {
                        PropertyRecord const * propertyRecord = nullptr;
                        if (nextKey == Constants::NoProperty)
                        {
                            this->scriptContext->GetOrAddPropertyRecord(propertyName, &propertyRecord);
                            nextKey = propertyRecord->GetPropertyId();
                        }
                        this->ReadObjectElement(propertyName, propertyRecord, obj, jsonObject, &stack);
                    }
                }
            }
        }
    }
    // JSONObject is an SList, which only has push/pop, so need to reverse list for it to be in order
    jsonObject->Reverse();
    const uint propertyCount = jsonObject->Count();

    this->CalculateStringifiedLength(propertyCount, stepbackLength);

    // Restore indent level
    this->indentLength = stepbackLength;

    return jsonObject;
}